

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall shared_ptr_count::release<Struct>(shared_ptr_count *this,Struct *p)

{
  long lVar1;
  long in_FS_OFFSET;
  Struct *p_local;
  shared_ptr_count *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->pn != (long *)0x0) {
    *this->pn = *this->pn + -1;
    if (*this->pn == 0) {
      if (p != (Struct *)0x0) {
        Struct::~Struct(p);
        operator_delete(p,4);
      }
      if (this->pn != (long *)0x0) {
        operator_delete(this->pn,8);
      }
    }
    this->pn = (long *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void release(U* p) throw() // never throws
    {
        if (NULL != pn)
        {
            --(*pn);
            if (0 == *pn)
            {
                delete p;
                delete pn;
            }
            pn = NULL;
        }
    }